

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_uniform_initializers.cpp
# Opt level: O3

void linker::set_uniform_initializer
               (void *mem_ctx,gl_shader_program *prog,char *name,glsl_type *type,ir_constant *val,
               uint boolean_true)

{
  char cVar1;
  char cVar2;
  glsl_type *pgVar3;
  int sh;
  char *pcVar4;
  ir_constant *val_00;
  glsl_type *pgVar5;
  gl_uniform_storage *pgVar6;
  byte bVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  glsl_base_type local_50;
  
  cVar1 = type->field_0x4;
  cVar2 = cVar1;
  pgVar5 = type;
  while (cVar2 == '\x11') {
    pgVar5 = (pgVar5->fields).array;
    cVar2 = pgVar5->field_0x4;
  }
  if (cVar1 == '\x0f') {
    if (type->length != 0) {
      lVar8 = 8;
      uVar10 = 0;
      do {
        pgVar5 = *(glsl_type **)((long)(type->fields).array + lVar8 + -8);
        pcVar4 = ralloc_asprintf(mem_ctx,"%s.%s",name,
                                 *(undefined8 *)((long)&((type->fields).array)->gl_type + lVar8));
        val_00 = ir_constant::get_record_field(val,(int)uVar10);
        set_uniform_initializer(mem_ctx,prog,pcVar4,pgVar5,val_00,boolean_true);
        uVar10 = uVar10 + 1;
        lVar8 = lVar8 + 0x30;
      } while (uVar10 < type->length);
    }
  }
  else {
    if (cVar2 == '\x0f') {
      pgVar5 = (type->fields).array;
    }
    else if ((cVar1 != '\x11') || (pgVar5 = (type->fields).array, pgVar5->field_0x4 != '\x11')) {
      pgVar6 = get_storage(prog,name);
      if (pgVar6 == (gl_uniform_storage *)0x0) {
        return;
      }
      pgVar5 = (val->super_ir_rvalue).type;
      if ((byte)pgVar5->field_0x4 == GLSL_TYPE_ARRAY) {
        pgVar3 = ((*val->const_elements)->super_ir_rvalue).type;
        uVar9 = *(glsl_base_type *)&pgVar3->field_0x4 - GLSL_TYPE_DOUBLE;
        bVar7 = 0;
        if ((byte)uVar9 < 10) {
          bVar7 = (byte)*(undefined4 *)(&DAT_0022b9e8 + (ulong)(uVar9 & 0xff) * 4);
        }
        if (pgVar6->array_elements <= pgVar5->length) {
          if (pgVar6->array_elements == 0) {
            return;
          }
          uVar9 = (uint)pgVar3->matrix_columns * (uint)pgVar3->vector_elements;
          local_50 = *(glsl_base_type *)&pgVar3->field_0x4 & 0xff;
          uVar11 = 0;
          uVar10 = 0;
          do {
            copy_constant_to_storage
                      (pgVar6->storage + uVar10,val->const_elements[uVar11],local_50,uVar9,
                       boolean_true);
            uVar10 = (ulong)((int)uVar10 + (uVar9 << (bVar7 & 0x1f)));
            uVar11 = uVar11 + 1;
          } while (uVar11 < pgVar6->array_elements);
          return;
        }
        __assert_fail("val->type->length >= storage->array_elements",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_initializers.cpp"
                      ,0xe5,
                      "void linker::set_uniform_initializer(void *, gl_shader_program *, const char *, const glsl_type *, ir_constant *, unsigned int)"
                     );
      }
      copy_constant_to_storage
                (pgVar6->storage,val,(uint)(byte)pgVar5->field_0x4,
                 (uint)pgVar5->matrix_columns * (uint)pgVar5->vector_elements,boolean_true);
      if (pgVar6->type->field_0x4 != '\f') {
        return;
      }
      lVar8 = 0;
      do {
        if ((prog->_LinkedShaders[lVar8] != (gl_linked_shader *)0x0) &&
           (pgVar6->opaque[lVar8].active == true)) {
          prog->_LinkedShaders[lVar8]->Program->SamplerUnits[pgVar6->opaque[lVar8].index] =
               *(GLubyte *)pgVar6->storage;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      return;
    }
    if (type->length != 0) {
      uVar10 = 0;
      do {
        pcVar4 = ralloc_asprintf(mem_ctx,"%s[%d]",name,uVar10 & 0xffffffff);
        set_uniform_initializer(mem_ctx,prog,pcVar4,pgVar5,val->const_elements[uVar10],boolean_true)
        ;
        uVar10 = uVar10 + 1;
      } while (uVar10 < type->length);
    }
  }
  return;
}

Assistant:

void
set_uniform_initializer(void *mem_ctx, gl_shader_program *prog,
                        const char *name, const glsl_type *type,
                        ir_constant *val, unsigned int boolean_true)
{
   const glsl_type *t_without_array = type->without_array();
   if (type->is_struct()) {
      for (unsigned int i = 0; i < type->length; i++) {
         const glsl_type *field_type = type->fields.structure[i].type;
         const char *field_name = ralloc_asprintf(mem_ctx, "%s.%s", name,
                                            type->fields.structure[i].name);
         set_uniform_initializer(mem_ctx, prog, field_name,
                                 field_type, val->get_record_field(i),
                                 boolean_true);
      }
      return;
   } else if (t_without_array->is_struct() ||
              (type->is_array() && type->fields.array->is_array())) {
      const glsl_type *const element_type = type->fields.array;

      for (unsigned int i = 0; i < type->length; i++) {
         const char *element_name = ralloc_asprintf(mem_ctx, "%s[%d]", name, i);

         set_uniform_initializer(mem_ctx, prog, element_name,
                                 element_type, val->const_elements[i],
                                 boolean_true);
      }
      return;
   }

   struct gl_uniform_storage *const storage = get_storage(prog, name);

   if (!storage)
      return;

   if (val->type->is_array()) {
      const enum glsl_base_type base_type =
         val->const_elements[0]->type->base_type;
      const unsigned int elements = val->const_elements[0]->type->components();
      unsigned int idx = 0;
      unsigned dmul = glsl_base_type_is_64bit(base_type) ? 2 : 1;

      assert(val->type->length >= storage->array_elements);
      for (unsigned int i = 0; i < storage->array_elements; i++) {
         copy_constant_to_storage(& storage->storage[idx],
                                  val->const_elements[i],
                                  base_type,
                                  elements,
                                  boolean_true);

         idx += elements * dmul;
      }
   } else {
      copy_constant_to_storage(storage->storage,
                               val,
                               val->type->base_type,
                               val->type->components(),
                               boolean_true);

      if (storage->type->is_sampler()) {
         for (int sh = 0; sh < MESA_SHADER_STAGES; sh++) {
            gl_linked_shader *shader = prog->_LinkedShaders[sh];

            if (shader && storage->opaque[sh].active) {
               unsigned index = storage->opaque[sh].index;

               shader->Program->SamplerUnits[index] = storage->storage[0].i;
            }
         }
      }
   }
}